

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O0

void __thiscall
front::irGenerator::irGenerator::insertFunc
          (irGenerator *this,string *key,shared_ptr<mir::inst::MirFunction> *func)

{
  element_type *peVar1;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
  this_00;
  value_type *in_RDX;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>
  *in_RSI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>,_bool>
  pVar2;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  MirFunction *in_stack_fffffffffffffe10;
  value_type *_type;
  string *_name;
  MirFunction *this_01;
  undefined1 local_198 [16];
  string local_188 [12];
  
  _type = in_RDX;
  peVar1 = std::
           __shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2554dc);
  _name = (string *)(local_198 + 0x10);
  std::__cxx11::string::string((string *)_name,(string *)&peVar1->name);
  std::__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x2554fc);
  this_01 = (MirFunction *)local_198;
  std::shared_ptr<mir::types::FunctionTy>::shared_ptr
            ((shared_ptr<mir::types::FunctionTy> *)in_stack_fffffffffffffe10,
             (shared_ptr<mir::types::FunctionTy> *)
             CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
  mir::inst::MirFunction::MirFunction(this_01,_name,(shared_ptr<mir::types::FunctionTy> *)_type);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_mir::inst::MirFunction,_true>
            (in_RSI,&in_RDX->first,in_stack_fffffffffffffe10);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                    *)in_RSI,in_RDX);
  this_00 = pVar2.first._M_node;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>
           *)this_00._M_node);
  mir::inst::MirFunction::~MirFunction((MirFunction *)this_00._M_node);
  std::shared_ptr<mir::types::FunctionTy>::~shared_ptr
            ((shared_ptr<mir::types::FunctionTy> *)0x25559a);
  std::__cxx11::string::~string((string *)(local_198 + 0x10));
  return;
}

Assistant:

void irGenerator::insertFunc(string key,
                             shared_ptr<mir::inst::MirFunction> func) {
  _package.functions.insert(
      {key, mir::inst::MirFunction(func->name, func->type)});
}